

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
SimulationDecPOMDPDiscrete::SimulationDecPOMDPDiscrete
          (SimulationDecPOMDPDiscrete *this,PlanningUnitDecPOMDPDiscrete *pu,Arguments *args)

{
  int *in_RDX;
  _func_int **in_RSI;
  Simulation *in_RDI;
  SimulationDecPOMDPDiscrete *in_stack_00000010;
  
  Simulation::Simulation(in_RDI,in_RDX[0x58],in_RDX[0x59]);
  in_RDI->_vptr_Simulation = (_func_int **)&PTR__SimulationDecPOMDPDiscrete_00d0d788;
  in_RDI[1]._vptr_Simulation = in_RSI;
  in_RDI[1]._m_verbose = false;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  if (3 < *in_RDX) {
    Simulation::SetVerbose(in_RDI,true);
  }
  Initialize(in_stack_00000010);
  return;
}

Assistant:

SimulationDecPOMDPDiscrete::
SimulationDecPOMDPDiscrete(const PlanningUnitDecPOMDPDiscrete &pu, 
                           const ArgumentHandlers::Arguments &args) : 
    Simulation(args.nrRuns, args.randomSeed),
    _m_pu(&pu),
    _m_saveIntermediateResults(false)
{
    if(args.verbose >= 4)
        SetVerbose(true);
    Initialize();
}